

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

float __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<float>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])();
  reader = this->m_reader;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    (*reader->_vptr_IIrrXMLReader[0xb])(reader,name);
    return extraout_XMM0_Da;
  }
  std::__cxx11::string::string((string *)&local_30,name,&local_51);
  std::__cxx11::string::string((string *)&local_50,"",&local_52);
  ThrowAttibuteError(reader,&local_30,&local_50);
}

Assistant:

float OgreXmlSerializer::ReadAttribute<float>(const char *name) const
{
    if (HasAttribute(name))
    {
        return m_reader->getAttributeValueAsFloat(name);
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
        return 0;
    }
}